

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGenericDiagonalMass.cpp
# Opt level: O1

ChVariablesGenericDiagonalMass * __thiscall
chrono::ChVariablesGenericDiagonalMass::operator=
          (ChVariablesGenericDiagonalMass *this,ChVariablesGenericDiagonalMass *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index size;
  Index index;
  ulong uVar13;
  long lVar14;
  
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    pdVar3 = (other->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar13 = (other->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar13) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 uVar13,1);
    }
    uVar4 = (this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if (uVar4 != uVar13) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar5 = (this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar13 = uVar4 + 7;
    if (-1 < (long)uVar4) {
      uVar13 = uVar4;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar4) {
      lVar14 = 0;
      do {
        pdVar1 = pdVar3 + lVar14;
        dVar6 = pdVar1[1];
        dVar7 = pdVar1[2];
        dVar8 = pdVar1[3];
        dVar9 = pdVar1[4];
        dVar10 = pdVar1[5];
        dVar11 = pdVar1[6];
        dVar12 = pdVar1[7];
        pdVar2 = pdVar5 + lVar14;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        pdVar2[2] = dVar7;
        pdVar2[3] = dVar8;
        pdVar2[4] = dVar9;
        pdVar2[5] = dVar10;
        pdVar2[6] = dVar11;
        pdVar2[7] = dVar12;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar4) {
      do {
        pdVar5[uVar13] = pdVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
  }
  return this;
}

Assistant:

ChVariablesGenericDiagonalMass& ChVariablesGenericDiagonalMass::operator=(const ChVariablesGenericDiagonalMass& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    MmassDiag = other.MmassDiag;

    return *this;
}